

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O1

void __thiscall Assimp::D3MF::D3MFExporter::writeObjects(D3MFExporter *this)

{
  ostringstream *poVar1;
  pointer *ppuVar2;
  char *__s;
  aiNode *paVar3;
  aiNode *paVar4;
  aiMesh *mesh;
  iterator __position;
  char cVar5;
  ostream *poVar6;
  size_t sVar7;
  ulong uVar8;
  uint local_3c;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_38;
  
  paVar3 = this->mScene->mRootNode;
  if ((paVar3 != (aiNode *)0x0) && (local_3c = 0, paVar3->mNumChildren != 0)) {
    poVar1 = &this->mModelOutput;
    local_38 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->mBuildItems;
    do {
      paVar4 = paVar3->mChildren[local_3c];
      if (paVar4 != (aiNode *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"<",1);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar1,XmlTag::object_abi_cxx11_,DAT_009028b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," id=\"",5);
        __s = (paVar4->mName).data;
        sVar7 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" type=\"model\">",0xf);
        cVar5 = (char)poVar1;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        if (paVar4->mNumMeshes != 0) {
          uVar8 = 0;
          do {
            mesh = this->mScene->mMeshes[paVar4->mMeshes[uVar8]];
            if (mesh != (aiMesh *)0x0) {
              writeMesh(this,mesh);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < paVar4->mNumMeshes);
        }
        __position._M_current =
             (this->mBuildItems).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->mBuildItems).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(local_38,__position,&local_3c);
        }
        else {
          *__position._M_current = local_3c;
          ppuVar2 = &(this->mBuildItems).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar2 = *ppuVar2 + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"</",2);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar1,XmlTag::object_abi_cxx11_,DAT_009028b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,">",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
      }
      local_3c = local_3c + 1;
    } while (local_3c < paVar3->mNumChildren);
  }
  return;
}

Assistant:

void D3MFExporter::writeObjects() {
    if ( nullptr == mScene->mRootNode ) {
        return;
    }

    aiNode *root = mScene->mRootNode;
    for ( unsigned int i = 0; i < root->mNumChildren; ++i ) {
        aiNode *currentNode( root->mChildren[ i ] );
        if ( nullptr == currentNode ) {
            continue;
        }
        mModelOutput << "<" << XmlTag::object << " id=\"" << currentNode->mName.C_Str() << "\" type=\"model\">";
        mModelOutput << std::endl;
        for ( unsigned int j = 0; j < currentNode->mNumMeshes; ++j ) {
            aiMesh *currentMesh = mScene->mMeshes[ currentNode->mMeshes[ j ] ];
            if ( nullptr == currentMesh ) {
                continue;
            }
            writeMesh( currentMesh );
        }
        mBuildItems.push_back( i );

        mModelOutput << "</" << XmlTag::object << ">";
        mModelOutput << std::endl;
    }
}